

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  byte bVar41;
  int iVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  ulong *puVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  uint uVar51;
  ulong uVar52;
  ulong *puVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uint uVar67;
  uint uVar68;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  uint uVar69;
  undefined1 auVar66 [16];
  vint4 bi;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  vint4 ai;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  float fVar91;
  float fVar92;
  undefined1 auVar87 [16];
  float fVar93;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  NodeRef stack [244];
  undefined8 local_8b8;
  float fStack_8b0;
  float fStack_8ac;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar54._4_4_ = uVar2;
  auVar54._0_4_ = uVar2;
  auVar54._8_4_ = uVar2;
  auVar54._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar55._4_4_ = uVar2;
  auVar55._0_4_ = uVar2;
  auVar55._8_4_ = uVar2;
  auVar55._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar56._4_4_ = uVar2;
  auVar56._0_4_ = uVar2;
  auVar56._8_4_ = uVar2;
  auVar56._12_4_ = uVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar48 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar42 = (tray->tnear).field_0.i[k];
  auVar57._4_4_ = iVar42;
  auVar57._0_4_ = iVar42;
  auVar57._8_4_ = iVar42;
  auVar57._12_4_ = iVar42;
  iVar42 = (tray->tfar).field_0.i[k];
  auVar58._4_4_ = iVar42;
  auVar58._0_4_ = iVar42;
  auVar58._8_4_ = iVar42;
  auVar58._12_4_ = iVar42;
  puVar53 = local_7d0;
LAB_00eddb81:
  do {
    puVar47 = puVar53;
    if (puVar47 == &local_7d8) {
LAB_00eddfb2:
      return puVar47 != &local_7d8;
    }
    puVar53 = puVar47 + -1;
    uVar50 = puVar47[-1];
    while ((uVar50 & 8) == 0) {
      auVar60 = vsubps_avx(*(undefined1 (*) [16])(uVar50 + 0x20 + uVar45),auVar54);
      auVar59._0_4_ = auVar60._0_4_ * fVar3;
      auVar59._4_4_ = auVar60._4_4_ * fVar3;
      auVar59._8_4_ = auVar60._8_4_ * fVar3;
      auVar59._12_4_ = auVar60._12_4_ * fVar3;
      auVar60 = vsubps_avx(*(undefined1 (*) [16])(uVar50 + 0x20 + uVar48),auVar55);
      auVar70._0_4_ = auVar60._0_4_ * fVar4;
      auVar70._4_4_ = auVar60._4_4_ * fVar4;
      auVar70._8_4_ = auVar60._8_4_ * fVar4;
      auVar70._12_4_ = auVar60._12_4_ * fVar4;
      auVar60 = vpmaxsd_avx(auVar59,auVar70);
      auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar50 + 0x20 + uVar49),auVar56);
      auVar71._0_4_ = auVar59._0_4_ * fVar5;
      auVar71._4_4_ = auVar59._4_4_ * fVar5;
      auVar71._8_4_ = auVar59._8_4_ * fVar5;
      auVar71._12_4_ = auVar59._12_4_ * fVar5;
      auVar59 = vpmaxsd_avx(auVar71,auVar57);
      auVar60 = vpmaxsd_avx(auVar60,auVar59);
      auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar50 + 0x20 + (uVar45 ^ 0x10)),auVar54);
      auVar72._0_4_ = auVar59._0_4_ * fVar3;
      auVar72._4_4_ = auVar59._4_4_ * fVar3;
      auVar72._8_4_ = auVar59._8_4_ * fVar3;
      auVar72._12_4_ = auVar59._12_4_ * fVar3;
      auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar50 + 0x20 + (uVar48 ^ 0x10)),auVar55);
      auVar78._0_4_ = auVar59._0_4_ * fVar4;
      auVar78._4_4_ = auVar59._4_4_ * fVar4;
      auVar78._8_4_ = auVar59._8_4_ * fVar4;
      auVar78._12_4_ = auVar59._12_4_ * fVar4;
      auVar59 = vpminsd_avx(auVar72,auVar78);
      auVar70 = vsubps_avx(*(undefined1 (*) [16])(uVar50 + 0x20 + (uVar49 ^ 0x10)),auVar56);
      auVar79._0_4_ = auVar70._0_4_ * fVar5;
      auVar79._4_4_ = auVar70._4_4_ * fVar5;
      auVar79._8_4_ = auVar70._8_4_ * fVar5;
      auVar79._12_4_ = auVar70._12_4_ * fVar5;
      auVar70 = vpminsd_avx(auVar79,auVar58);
      auVar59 = vpminsd_avx(auVar59,auVar70);
      auVar60 = vpcmpgtd_avx(auVar60,auVar59);
      iVar42 = vmovmskps_avx(auVar60);
      if (iVar42 == 0xf) goto LAB_00eddb81;
      bVar41 = (byte)iVar42 ^ 0xf;
      uVar43 = uVar50 & 0xfffffffffffffff0;
      lVar46 = 0;
      if (bVar41 != 0) {
        for (; (bVar41 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
        }
      }
      uVar50 = *(ulong *)(uVar43 + lVar46 * 8);
      uVar51 = bVar41 - 1 & (uint)bVar41;
      uVar52 = (ulong)uVar51;
      if (uVar51 != 0) {
        do {
          *puVar53 = uVar50;
          puVar53 = puVar53 + 1;
          lVar46 = 0;
          if (uVar52 != 0) {
            for (; (uVar52 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
            }
          }
          uVar50 = *(ulong *)(uVar43 + lVar46 * 8);
          uVar52 = uVar52 - 1 & uVar52;
        } while (uVar52 != 0);
      }
    }
    uVar43 = uVar50 & 0xfffffffffffffff0;
    for (lVar46 = 0; lVar46 != (ulong)((uint)uVar50 & 0xf) - 8; lVar46 = lVar46 + 1) {
      lVar44 = lVar46 * 0xb0;
      pfVar1 = (float *)(uVar43 + 0x80 + lVar44);
      fVar17 = *pfVar1;
      fVar18 = pfVar1[1];
      fVar19 = pfVar1[2];
      fVar20 = pfVar1[3];
      pfVar1 = (float *)(uVar43 + 0x40 + lVar44);
      fVar21 = *pfVar1;
      fVar22 = pfVar1[1];
      fVar23 = pfVar1[2];
      fVar24 = pfVar1[3];
      auVar73._0_4_ = fVar17 * fVar21;
      auVar73._4_4_ = fVar18 * fVar22;
      auVar73._8_4_ = fVar19 * fVar23;
      auVar73._12_4_ = fVar20 * fVar24;
      pfVar1 = (float *)(uVar43 + 0x70 + lVar44);
      fVar25 = *pfVar1;
      fVar26 = pfVar1[1];
      fVar27 = pfVar1[2];
      fVar28 = pfVar1[3];
      pfVar1 = (float *)(uVar43 + 0x50 + lVar44);
      fVar29 = *pfVar1;
      fVar30 = pfVar1[1];
      fVar31 = pfVar1[2];
      fVar32 = pfVar1[3];
      auVar87._0_4_ = fVar25 * fVar29;
      auVar87._4_4_ = fVar26 * fVar30;
      auVar87._8_4_ = fVar27 * fVar31;
      auVar87._12_4_ = fVar28 * fVar32;
      auVar71 = vsubps_avx(auVar87,auVar73);
      pfVar1 = (float *)(uVar43 + 0x60 + lVar44);
      fVar33 = *pfVar1;
      fVar34 = pfVar1[1];
      fVar35 = pfVar1[2];
      fVar36 = pfVar1[3];
      auVar74._0_4_ = fVar29 * fVar33;
      auVar74._4_4_ = fVar30 * fVar34;
      auVar74._8_4_ = fVar31 * fVar35;
      auVar74._12_4_ = fVar32 * fVar36;
      pfVar1 = (float *)(uVar43 + 0x30 + lVar44);
      fVar37 = *pfVar1;
      fVar38 = pfVar1[1];
      fVar39 = pfVar1[2];
      fVar40 = pfVar1[3];
      auVar60._0_4_ = fVar17 * fVar37;
      auVar60._4_4_ = fVar18 * fVar38;
      auVar60._8_4_ = fVar19 * fVar39;
      auVar60._12_4_ = fVar20 * fVar40;
      auVar60 = vsubps_avx(auVar60,auVar74);
      auVar61._0_4_ = fVar25 * fVar37;
      auVar61._4_4_ = fVar26 * fVar38;
      auVar61._8_4_ = fVar27 * fVar39;
      auVar61._12_4_ = fVar28 * fVar40;
      auVar75._0_4_ = fVar21 * fVar33;
      auVar75._4_4_ = fVar22 * fVar34;
      auVar75._8_4_ = fVar23 * fVar35;
      auVar75._12_4_ = fVar24 * fVar36;
      auVar72 = vsubps_avx(auVar75,auVar61);
      uVar2 = *(undefined4 *)(ray + k * 4);
      auVar62._4_4_ = uVar2;
      auVar62._0_4_ = uVar2;
      auVar62._8_4_ = uVar2;
      auVar62._12_4_ = uVar2;
      auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar43 + lVar44),auVar62);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar63._4_4_ = uVar2;
      auVar63._0_4_ = uVar2;
      auVar63._8_4_ = uVar2;
      auVar63._12_4_ = uVar2;
      auVar70 = vsubps_avx(*(undefined1 (*) [16])(uVar43 + 0x10 + lVar44),auVar63);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar64._4_4_ = uVar2;
      auVar64._0_4_ = uVar2;
      auVar64._8_4_ = uVar2;
      auVar64._12_4_ = uVar2;
      auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar43 + 0x20 + lVar44),auVar64);
      fVar6 = *(float *)(ray + k * 4 + 0x50);
      fVar7 = *(float *)(ray + k * 4 + 0x60);
      fVar9 = auVar78._0_4_;
      auVar94._0_4_ = fVar6 * fVar9;
      fVar11 = auVar78._4_4_;
      auVar94._4_4_ = fVar6 * fVar11;
      fVar13 = auVar78._8_4_;
      auVar94._8_4_ = fVar6 * fVar13;
      fVar15 = auVar78._12_4_;
      auVar94._12_4_ = fVar6 * fVar15;
      fVar10 = auVar70._0_4_;
      auVar80._0_4_ = fVar7 * fVar10;
      fVar12 = auVar70._4_4_;
      auVar80._4_4_ = fVar7 * fVar12;
      fVar14 = auVar70._8_4_;
      auVar80._8_4_ = fVar7 * fVar14;
      fVar16 = auVar70._12_4_;
      auVar80._12_4_ = fVar7 * fVar16;
      auVar70 = vsubps_avx(auVar80,auVar94);
      fVar8 = *(float *)(ray + k * 4 + 0x40);
      fVar86 = auVar59._0_4_;
      auVar95._0_4_ = fVar86 * fVar7;
      fVar91 = auVar59._4_4_;
      auVar95._4_4_ = fVar91 * fVar7;
      fVar92 = auVar59._8_4_;
      auVar95._8_4_ = fVar92 * fVar7;
      fVar93 = auVar59._12_4_;
      auVar95._12_4_ = fVar93 * fVar7;
      auVar83._0_4_ = fVar8 * fVar9;
      auVar83._4_4_ = fVar8 * fVar11;
      auVar83._8_4_ = fVar8 * fVar13;
      auVar83._12_4_ = fVar8 * fVar15;
      auVar59 = vsubps_avx(auVar83,auVar95);
      auVar84._0_4_ = fVar8 * fVar10;
      auVar84._4_4_ = fVar8 * fVar12;
      auVar84._8_4_ = fVar8 * fVar14;
      auVar84._12_4_ = fVar8 * fVar16;
      auVar88._0_4_ = fVar6 * fVar86;
      auVar88._4_4_ = fVar6 * fVar91;
      auVar88._8_4_ = fVar6 * fVar92;
      auVar88._12_4_ = fVar6 * fVar93;
      auVar78 = vsubps_avx(auVar88,auVar84);
      local_8b8._0_4_ = auVar60._0_4_;
      local_8b8._4_4_ = auVar60._4_4_;
      fStack_8b0 = auVar60._8_4_;
      fStack_8ac = auVar60._12_4_;
      auVar81._0_4_ = auVar71._0_4_ * fVar8 + fVar6 * (float)local_8b8 + auVar72._0_4_ * fVar7;
      auVar81._4_4_ = auVar71._4_4_ * fVar8 + fVar6 * local_8b8._4_4_ + auVar72._4_4_ * fVar7;
      auVar81._8_4_ = auVar71._8_4_ * fVar8 + fVar6 * fStack_8b0 + auVar72._8_4_ * fVar7;
      auVar81._12_4_ = auVar71._12_4_ * fVar8 + fVar6 * fStack_8ac + auVar72._12_4_ * fVar7;
      local_898 = auVar70._0_4_;
      fStack_894 = auVar70._4_4_;
      fStack_890 = auVar70._8_4_;
      fStack_88c = auVar70._12_4_;
      auVar65._8_4_ = 0x80000000;
      auVar65._0_8_ = 0x8000000080000000;
      auVar65._12_4_ = 0x80000000;
      auVar60 = vandps_avx(auVar81,auVar65);
      uVar51 = auVar60._0_4_;
      auVar89._0_4_ =
           (float)(uVar51 ^ (uint)(local_898 * fVar33 +
                                  auVar78._0_4_ * fVar17 + auVar59._0_4_ * fVar25));
      uVar67 = auVar60._4_4_;
      auVar89._4_4_ =
           (float)(uVar67 ^ (uint)(fStack_894 * fVar34 +
                                  auVar78._4_4_ * fVar18 + auVar59._4_4_ * fVar26));
      uVar68 = auVar60._8_4_;
      auVar89._8_4_ =
           (float)(uVar68 ^ (uint)(fStack_890 * fVar35 +
                                  auVar78._8_4_ * fVar19 + auVar59._8_4_ * fVar27));
      uVar69 = auVar60._12_4_;
      auVar89._12_4_ =
           (float)(uVar69 ^ (uint)(fStack_88c * fVar36 +
                                  auVar78._12_4_ * fVar20 + auVar59._12_4_ * fVar28));
      auVar76._0_4_ =
           (float)(uVar51 ^ (uint)(local_898 * fVar37 +
                                  auVar78._0_4_ * fVar29 + auVar59._0_4_ * fVar21));
      auVar76._4_4_ =
           (float)(uVar67 ^ (uint)(fStack_894 * fVar38 +
                                  auVar78._4_4_ * fVar30 + auVar59._4_4_ * fVar22));
      auVar76._8_4_ =
           (float)(uVar68 ^ (uint)(fStack_890 * fVar39 +
                                  auVar78._8_4_ * fVar31 + auVar59._8_4_ * fVar23));
      auVar76._12_4_ =
           (float)(uVar69 ^ (uint)(fStack_88c * fVar40 +
                                  auVar78._12_4_ * fVar32 + auVar59._12_4_ * fVar24));
      auVar70 = ZEXT816(0) << 0x20;
      auVar60 = vcmpps_avx(auVar89,auVar70,5);
      auVar59 = vcmpps_avx(auVar76,auVar70,5);
      auVar60 = vandps_avx(auVar60,auVar59);
      auVar59 = vcmpps_avx(auVar81,auVar70,4);
      auVar60 = vandps_avx(auVar60,auVar59);
      auVar77._0_4_ = auVar89._0_4_ + auVar76._0_4_;
      auVar77._4_4_ = auVar89._4_4_ + auVar76._4_4_;
      auVar77._8_4_ = auVar89._8_4_ + auVar76._8_4_;
      auVar77._12_4_ = auVar89._12_4_ + auVar76._12_4_;
      auVar90._8_4_ = 0x7fffffff;
      auVar90._0_8_ = 0x7fffffff7fffffff;
      auVar90._12_4_ = 0x7fffffff;
      auVar59 = vandps_avx(auVar81,auVar90);
      auVar70 = vcmpps_avx(auVar77,auVar59,2);
      auVar78 = auVar70 & auVar60;
      if ((((auVar78 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar78 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar78 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar78[0xf] < '\0'
         ) {
        auVar60 = vandps_avx(auVar60,auVar70);
        auVar66._0_4_ =
             uVar51 ^ (uint)(auVar71._0_4_ * fVar86 +
                            fVar10 * (float)local_8b8 + fVar9 * auVar72._0_4_);
        auVar66._4_4_ =
             uVar67 ^ (uint)(auVar71._4_4_ * fVar91 +
                            fVar12 * local_8b8._4_4_ + fVar11 * auVar72._4_4_);
        auVar66._8_4_ =
             uVar68 ^ (uint)(auVar71._8_4_ * fVar92 + fVar14 * fStack_8b0 + fVar13 * auVar72._8_4_);
        auVar66._12_4_ =
             uVar69 ^ (uint)(auVar71._12_4_ * fVar93 + fVar16 * fStack_8ac + fVar15 * auVar72._12_4_
                            );
        fVar6 = *(float *)(ray + k * 4 + 0x30);
        auVar85._0_4_ = auVar59._0_4_ * fVar6;
        auVar85._4_4_ = auVar59._4_4_ * fVar6;
        auVar85._8_4_ = auVar59._8_4_ * fVar6;
        auVar85._12_4_ = auVar59._12_4_ * fVar6;
        auVar70 = vcmpps_avx(auVar85,auVar66,1);
        fVar6 = *(float *)(ray + k * 4 + 0x80);
        auVar82._0_4_ = auVar59._0_4_ * fVar6;
        auVar82._4_4_ = auVar59._4_4_ * fVar6;
        auVar82._8_4_ = auVar59._8_4_ * fVar6;
        auVar82._12_4_ = auVar59._12_4_ * fVar6;
        auVar59 = vcmpps_avx(auVar66,auVar82,2);
        auVar59 = vandps_avx(auVar70,auVar59);
        auVar60 = vandps_avx(auVar59,auVar60);
        iVar42 = vmovmskps_avx(auVar60);
        if (iVar42 != 0) {
          local_8b8._0_1_ = (byte)iVar42;
          local_8b8 = (ulong)(byte)local_8b8;
          do {
            uVar52 = 0;
            if (local_8b8 != 0) {
              for (; (local_8b8 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
              }
            }
            if ((((context->scene->geometries).items[*(uint *)(lVar44 + uVar43 + 0x90 + uVar52 * 4)]
                 .ptr)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
              goto LAB_00eddfb2;
            }
            local_8b8 = local_8b8 ^ 1L << (uVar52 & 0x3f);
          } while (local_8b8 != 0);
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }